

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O2

ChMatrix33<double> * __thiscall
chrono::fea::ChElementShellANCF_3443::GetGreenLagrangeStrain
          (ChMatrix33<double> *__return_storage_ptr__,ChElementShellANCF_3443 *this,double xi,
          double eta,double zeta)

{
  ChMatrix33<double> I3x3;
  ChMatrixNMc<double,_3,_3> F;
  ChMatrix33<double> J_0xi;
  Matrix3xN e_bar;
  MatrixNx3c Sxi_D;
  double local_4c0;
  NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *local_4b8;
  NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *local_4b0;
  DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_Eigen::Matrix<double,_16,_3,_0,_16,_3>,_0>_>
  *local_4a8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
  local_498;
  Product<Eigen::Matrix<double,_16,_3,_0,_16,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>
  *local_458;
  Matrix<double,_16,_3,_0,_16,_3> *local_450;
  Matrix<double,_3,_3,_1,_3,_3> *local_410 [9];
  Matrix<double,_3,_3,_1,_3,_3> local_3c8;
  Product<Eigen::Matrix<double,_16,_3,_0,_16,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>
  local_380 [24];
  Matrix<double,_16,_3,_0,_16,_3> local_200;
  
  Calc_Sxi_D(this,&local_200,xi,eta,zeta,this->m_thicknessZ,this->m_midsurfoffset);
  local_380[0].m_lhs = (LhsNested)&this->m_ebar0;
  local_410[0] = &local_3c8;
  local_380[0].m_rhs.m_xpr = (XprTypeNested)&local_200;
  Eigen::NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *)local_410,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_Eigen::Matrix<double,_16,_3,_0,_16,_3>,_0>_>
              *)local_380);
  local_380[0].m_lhs = &local_200;
  local_380[0].m_rhs.m_xpr = &local_3c8;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,16,3,0,16,3>,Eigen::Product<Eigen::Matrix<double,16,3,0,16,3>,Eigen::Inverse<Eigen::Matrix<double,3,3,1,3,3>>,0>>
            (&local_200,local_380);
  CalcCoordMatrix(this,(Matrix3xN *)local_380);
  local_458 = local_380;
  local_450 = &local_200;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,16,1,3,16>,Eigen::Matrix<double,16,3,0,16,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_410,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_Eigen::Matrix<double,_16,_3,_0,_16,_3>,_0>_>
              *)&local_458);
  Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_false>::run
            ((Matrix<double,_3,_3,_1,_3,_3> *)&local_458);
  local_4c0 = 0.5;
  local_4b8 = (NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *)local_410;
  local_4b0 = (NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *)local_410;
  local_4a8 = (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_Eigen::Matrix<double,_16,_3,_0,_16,_3>,_0>_>
               *)&local_458;
  Eigen::operator*(&local_498,&local_4c0,(StorageBaseType *)&local_4b8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Matrix<double,3,3,1,3,3>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)__return_storage_ptr__,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
              *)&local_498);
  return __return_storage_ptr__;
}

Assistant:

ChMatrix33<> ChElementShellANCF_3443::GetGreenLagrangeStrain(const double xi, const double eta, const double zeta) {
    MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives
    Calc_Sxi_D(Sxi_D, xi, eta, zeta, m_thicknessZ, m_midsurfoffset);

    ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
    J_0xi.noalias() = m_ebar0 * Sxi_D;

    Sxi_D = Sxi_D * J_0xi.inverse();  // Adjust the shape function derivative matrix to account for the potentially
                                      // distorted reference configuration

    Matrix3xN e_bar;  // Element coordinates in matrix form
    CalcCoordMatrix(e_bar);

    // Calculate the Deformation Gradient at the current point
    ChMatrixNMc<double, 3, 3> F = e_bar * Sxi_D;

    ChMatrix33<> I3x3;
    I3x3.setIdentity();
    return 0.5 * (F.transpose() * F - I3x3);
}